

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O0

int32_t float128_to_int32_mips(float128 a,float_status *status)

{
  float128 a_00;
  float128 a_01;
  float128 a_02;
  int32_t iVar1;
  uint64_t uVar2;
  uint64_t aSig1;
  uint64_t aSig0;
  int local_28;
  int32_t shiftCount;
  int32_t aExp;
  flag aSign;
  float_status *status_local;
  float128 a_local;
  
  a_local.low = a.high;
  status_local = (float_status *)a.low;
  _aExp = status;
  uVar2 = extractFloat128Frac1(a);
  a_00.high = a_local.low;
  a_00.low = (uint64_t)status_local;
  aSig1 = extractFloat128Frac0(a_00);
  a_01.high = a_local.low;
  a_01.low = (uint64_t)status_local;
  local_28 = extractFloat128Exp(a_01);
  a_02.high = a_local.low;
  a_02.low = (uint64_t)status_local;
  shiftCount._3_1_ = extractFloat128Sign(a_02);
  if ((local_28 == 0x7fff) && (aSig1 != 0 || uVar2 != 0)) {
    shiftCount._3_1_ = '\0';
  }
  if (local_28 != 0) {
    aSig1 = aSig1 | 0x1000000000000;
  }
  aSig1 = (long)(int)(uint)(uVar2 != 0) | aSig1;
  aSig0._4_4_ = 0x4028 - local_28;
  if (0 < aSig0._4_4_) {
    shift64RightJamming(aSig1,aSig0._4_4_,&aSig1);
  }
  iVar1 = roundAndPackInt32(shiftCount._3_1_,aSig1,_aExp);
  return iVar1;
}

Assistant:

int32_t float128_to_int32(float128 a, float_status *status)
{
    flag aSign;
    int32_t aExp, shiftCount;
    uint64_t aSig0, aSig1;

    aSig1 = extractFloat128Frac1( a );
    aSig0 = extractFloat128Frac0( a );
    aExp = extractFloat128Exp( a );
    aSign = extractFloat128Sign( a );
    if ( ( aExp == 0x7FFF ) && ( aSig0 | aSig1 ) ) aSign = 0;
    if ( aExp ) aSig0 |= UINT64_C(0x0001000000000000);
    aSig0 |= ( aSig1 != 0 );
    shiftCount = 0x4028 - aExp;
    if ( 0 < shiftCount ) shift64RightJamming( aSig0, shiftCount, &aSig0 );
    return roundAndPackInt32(aSign, aSig0, status);

}